

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

bool __thiscall PSEngine::basic_movement_resolution(PSEngine *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer pCVar3;
  element_type *peVar4;
  pointer pOVar5;
  bool bVar6;
  _Rb_tree_node_base *p_Var7;
  Cell *pCVar8;
  iterator iVar9;
  size_type sVar10;
  pointer pCVar11;
  value_type *__x;
  pointer pOVar12;
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> current_cell_objects_to_move;
  set<std::shared_ptr<CompiledGame::CollisionLayer>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
  current_col_layers;
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> objects_to_move;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  objects_to_move.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_to_move.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  objects_to_move.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar11 = (this->m_current_level).cells.
            super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar3 = (this->m_current_level).cells.
           super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    pOVar5 = objects_to_move.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pCVar11 == pCVar3) {
      pOVar12 = objects_to_move.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
      goto LAB_001124a9;
    }
    current_cell_objects_to_move.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    current_cell_objects_to_move.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    current_cell_objects_to_move.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var1 = &(pCVar11->objects)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var7 = (pCVar11->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pOVar5 = current_cell_objects_to_move.
                 super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
                 super__Vector_impl_data._M_finish,
        __x = current_cell_objects_to_move.
              super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
              super__Vector_impl_data._M_start, (_Rb_tree_header *)p_Var7 != p_Var1;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      iVar2 = *(int *)&p_Var7[1]._M_left;
      if (iVar2 == 0) {
        if ((int)(this->m_config).log_verbosity < 5) {
          peVar4 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__cxx11::string::string(local_70,(string *)&m_engine_log_cat_abi_cxx11_);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_50,"an objec move type is set to none, this should never happen",
                     (allocator<char> *)&current_col_layers);
          (*peVar4->_vptr_PSLogger[2])(peVar4,4,local_70,local_50);
          std::__cxx11::string::~string(local_50);
          std::__cxx11::string::~string(local_70);
          if ((this->m_config).log_operation_history_after_error == true) {
            print_operation_history(this);
          }
        }
      }
      else if (iVar2 != 6) {
        if (iVar2 == 5) {
          *(undefined4 *)&p_Var7[1]._M_left = 6;
        }
        else {
          current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
          current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
          ;
          current_col_layers._M_t._M_impl._0_8_ = pCVar11->position;
          std::__shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2> *)
                     &current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (__shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2> *)
                     (p_Var7 + 1));
          bVar6 = get_move_destination_coord
                            (this,pCVar11->position,*(ObjectMoveType *)&p_Var7[1]._M_left,
                             (PSVector2i *)&current_col_layers._M_t._M_impl.super__Rb_tree_header);
          if (!bVar6) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
            goto LAB_00112474;
          }
          std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::push_back
                    (&current_cell_objects_to_move,(value_type *)&current_col_layers);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
        }
      }
    }
    for (; __x != pOVar5; __x = __x + 1) {
      std::
      _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
      ::erase(&(pCVar11->objects)._M_t,&__x->obj);
      std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::push_back(&objects_to_move,__x);
    }
LAB_00112474:
    std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::~vector
              (&current_cell_objects_to_move);
    pCVar11 = pCVar11 + 1;
  } while ((_Rb_tree_header *)p_Var7 == p_Var1);
LAB_00112706:
  bVar6 = false;
LAB_00112708:
  std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::~vector(&objects_to_move);
  return bVar6;
LAB_001124a9:
  if (pOVar12 == pOVar5) goto LAB_0011251a;
  pCVar8 = get_cell_at(this,pOVar12->destination);
  if (pCVar8 == (Cell *)0x0) {
    if ((int)(this->m_config).log_verbosity < 5) {
      peVar4 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string(local_90,(string *)&m_engine_log_cat_abi_cxx11_);
      std::__cxx11::string::string<std::allocator<char>>
                (local_b0,"should not happen!",(allocator<char> *)&current_col_layers);
      (*peVar4->_vptr_PSLogger[2])(peVar4,4,local_90,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_90);
      if ((this->m_config).log_operation_history_after_error != false) {
LAB_001126f5:
        print_operation_history(this);
      }
    }
    goto LAB_00112706;
  }
  iVar9 = std::
          _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
          ::find(&(pCVar8->objects)._M_t,&pOVar12->obj);
  if ((_Rb_tree_header *)iVar9._M_node != &(pCVar8->objects)._M_t._M_impl.super__Rb_tree_header) {
    if ((int)(this->m_config).log_verbosity < 5) {
      peVar4 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string(local_d0,(string *)&m_engine_log_cat_abi_cxx11_);
      std::__cxx11::string::string<std::allocator<char>>
                (local_f0,
                 "this object already exist in the destination cell, basic movement resolution cannot proceed."
                 ,(allocator<char> *)&current_col_layers);
      (*peVar4->_vptr_PSLogger[2])(peVar4,4,local_d0,local_f0);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_d0);
      if ((this->m_config).log_operation_history_after_error == true) goto LAB_001126f5;
    }
    goto LAB_00112706;
  }
  std::__shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2> *)
             &current_col_layers,
             &(pOVar12->obj).
              super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>);
  current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       CONCAT44(current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,6);
  std::
  _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>,std::_Select1st<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
  ::
  _M_emplace_unique<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>,PSEngine::ObjectMoveType>>
            ((_Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>,std::_Select1st<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
              *)&pCVar8->objects,
             (pair<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *)
             &current_col_layers);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &current_col_layers._M_t._M_impl.super__Rb_tree_header);
  pOVar12 = pOVar12 + 1;
  goto LAB_001124a9;
LAB_0011251a:
  pCVar3 = (this->m_current_level).cells.
           super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar11 = (this->m_current_level).cells.
                 super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
                 super__Vector_impl_data._M_start; pCVar11 != pCVar3; pCVar11 = pCVar11 + 1) {
    if (1 < (pCVar11->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
           0xffffffff00000000;
      current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header;
      current_col_layers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           current_col_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var7 = (pCVar11->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &(pCVar11->objects)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        std::__shared_ptr<CompiledGame::CollisionLayer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<CompiledGame::CollisionLayer,_(__gnu_cxx::_Lock_policy)2> *)
                   &current_cell_objects_to_move,*(long *)(p_Var7 + 1) + 0x38);
        sVar10 = std::
                 set<std::shared_ptr<CompiledGame::CollisionLayer>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
                 ::count(&current_col_layers,(key_type *)&current_cell_objects_to_move);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &current_cell_objects_to_move.
                    super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        if (sVar10 != 0) {
          std::
          _Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,_std::shared_ptr<CompiledGame::CollisionLayer>,_std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
          ::~_Rb_tree(&current_col_layers._M_t);
          goto LAB_00112706;
        }
        std::__shared_ptr<CompiledGame::CollisionLayer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<CompiledGame::CollisionLayer,_(__gnu_cxx::_Lock_policy)2> *)
                   &current_cell_objects_to_move,*(long *)(p_Var7 + 1) + 0x38);
        std::
        _Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,std::shared_ptr<CompiledGame::CollisionLayer>,std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>>,std::less<std::shared_ptr<CompiledGame::CollisionLayer>>,std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>>>
        ::_M_insert_unique<std::shared_ptr<CompiledGame::CollisionLayer>>
                  ((_Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,std::shared_ptr<CompiledGame::CollisionLayer>,std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>>,std::less<std::shared_ptr<CompiledGame::CollisionLayer>>,std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>>>
                    *)&current_col_layers,
                   (shared_ptr<CompiledGame::CollisionLayer> *)&current_cell_objects_to_move);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &current_cell_objects_to_move.
                    super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      }
      std::
      _Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,_std::shared_ptr<CompiledGame::CollisionLayer>,_std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,_std::shared_ptr<CompiledGame::CollisionLayer>,_std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
                   *)&current_col_layers);
    }
  }
  bVar6 = true;
  goto LAB_00112708;
}

Assistant:

bool PSEngine::basic_movement_resolution()
{
    struct ObjectMoveInfo
    {
        PSVector2i origin;
        PSVector2i destination;

        shared_ptr<CompiledGame::PrimaryObject> obj;
    };

    vector<ObjectMoveInfo> objects_to_move;

    for(Cell& cell : m_current_level.cells)
    {
        vector<ObjectMoveInfo> current_cell_objects_to_move;

        for(auto& pair : cell.objects )
        {
            if(pair.second == ObjectMoveType::Action)
            {
                pair.second = ObjectMoveType::Stationary;
            }
            else if(pair.second != ObjectMoveType::Stationary)
            {
                if(pair.second == ObjectMoveType::None)
                {
                    PS_LOG_ERROR("an objec move type is set to none, this should never happen");
                    continue;
                }
                ObjectMoveInfo move_info;
                move_info.origin = cell.position;
                move_info.obj = pair.first;

                //if some movement is invalid, the whole basic movement resolution is invalid
                if( !get_move_destination_coord(cell.position,pair.second,move_info.destination))
                {
                    return false;
                }

                current_cell_objects_to_move.push_back(move_info);
            }
        }

        for(const auto& elem :current_cell_objects_to_move)
        {
            cell.objects.erase(elem.obj);

            objects_to_move.push_back(elem);
        }
    }

    for(const auto& move_info : objects_to_move)
    {
        //check if object is not already in cell
        Cell* dest_cell = get_cell_at(move_info.destination);

        if(dest_cell == nullptr)
        {
            PS_LOG_ERROR("should not happen!");
            return false;
        }

        if(dest_cell->objects.find(move_info.obj) != dest_cell->objects.end())
        {
            //moving objects were temporarily removed from the level so only static ones should be detected here
            PS_LOG_ERROR("this object already exist in the destination cell, basic movement resolution cannot proceed.");
            return false;
        }

        dest_cell->objects.insert(make_pair(move_info.obj, ObjectMoveType::Stationary));

    }

    //check if there's no collisions
    for(Cell& cell : m_current_level.cells)
    {
        if(cell.objects.size() <= 1)
        {
            continue;
        }

        set<shared_ptr<CompiledGame::CollisionLayer>> current_col_layers;

        for(auto& pair : cell.objects )
        {
            if( current_col_layers.count(pair.first->collision_layer.lock()) != 0)
            {
                return false; //collision was detected;
            }
            current_col_layers.insert(pair.first->collision_layer.lock());
        }
    }

    return true;
}